

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qBlendTexture(int count,QT_FT_Span *spans,void *userData)

{
  TextureBlendType TVar1;
  QSpanData *in_RDX;
  QT_FT_Span *in_RSI;
  int in_EDI;
  ProcessSpans proc;
  TextureBlendType blendType;
  QSpanData *data;
  ProcessSpans local_30;
  
  TVar1 = getBlendType(in_RDX);
  switch(in_RDX->rasterBuffer->format) {
  case Format_Invalid:
  case Format_ARGB32_Premultiplied:
    local_30 = processTextureSpansARGB32PM[TVar1];
    break;
  default:
    local_30 = processTextureSpansGeneric[TVar1];
    break;
  case Format_ARGB32:
  case Format_RGBA8888:
  case Format_BGR30:
  case Format_A2BGR30_Premultiplied:
  case Format_RGB30:
  case Format_A2RGB30_Premultiplied:
  case Format_RGBX64:
  case Format_RGBA64:
  case Format_RGBA64_Premultiplied:
  case Format_Grayscale16:
    local_30 = processTextureSpansGeneric64[TVar1];
    break;
  case Format_RGB16:
    local_30 = processTextureSpansRGB16[TVar1];
    break;
  case Format_RGBX16FPx4:
  case Format_RGBA16FPx4:
  case Format_RGBA16FPx4_Premultiplied:
  case Format_RGBX32FPx4:
  case Format_RGBA32FPx4:
  case Format_RGBA32FPx4_Premultiplied:
    local_30 = processTextureSpansGenericFP[TVar1];
  }
  (*local_30)(in_EDI,in_RSI,in_RDX);
  return;
}

Assistant:

void qBlendTexture(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    TextureBlendType blendType = getBlendType(data);
    ProcessSpans proc;
    switch (data->rasterBuffer->format) {
    case QImage::Format_Invalid:
        Q_UNREACHABLE_RETURN();
    case QImage::Format_ARGB32_Premultiplied:
        proc = processTextureSpansARGB32PM[blendType];
        break;
    case QImage::Format_RGB16:
        proc = processTextureSpansRGB16[blendType];
        break;
#if defined(__SSE2__) || defined(__ARM_NEON__) || defined(QT_COMPILER_SUPPORTS_LSX) || (Q_PROCESSOR_WORDSIZE == 8)
    case QImage::Format_ARGB32:
    case QImage::Format_RGBA8888:
#endif
    case QImage::Format_BGR30:
    case QImage::Format_A2BGR30_Premultiplied:
    case QImage::Format_RGB30:
    case QImage::Format_A2RGB30_Premultiplied:
    case QImage::Format_RGBX64:
    case QImage::Format_RGBA64:
    case QImage::Format_RGBA64_Premultiplied:
    case QImage::Format_Grayscale16:
#if !QT_CONFIG(raster_fp)
    case QImage::Format_RGBX16FPx4:
    case QImage::Format_RGBA16FPx4:
    case QImage::Format_RGBA16FPx4_Premultiplied:
    case QImage::Format_RGBX32FPx4:
    case QImage::Format_RGBA32FPx4:
    case QImage::Format_RGBA32FPx4_Premultiplied:
#endif
#if QT_CONFIG(raster_64bit)
        proc = processTextureSpansGeneric64[blendType];
        break;
#endif // QT_CONFIG(raster_64bit)
#if QT_CONFIG(raster_fp)
    case QImage::Format_RGBX16FPx4:
    case QImage::Format_RGBA16FPx4:
    case QImage::Format_RGBA16FPx4_Premultiplied:
    case QImage::Format_RGBX32FPx4:
    case QImage::Format_RGBA32FPx4:
    case QImage::Format_RGBA32FPx4_Premultiplied:
        proc = processTextureSpansGenericFP[blendType];
        break;
#endif
    default:
        proc = processTextureSpansGeneric[blendType];
        break;
    }
    proc(count, spans, userData);
}